

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListView::doItemsLayout(QListView *this)

{
  bool bVar1;
  int iVar2;
  LayoutMode LVar3;
  QListViewPrivate *this_00;
  QBasicTimer *in_RDI;
  long in_FS_OFFSET;
  State oldState;
  QListViewPrivate *d;
  State in_stack_ffffffffffffff8c;
  QListViewPrivate *in_stack_ffffffffffffff90;
  QObject *in_stack_ffffffffffffff98;
  QListViewPrivate *this_01;
  QPersistentModelIndex local_38 [3];
  QPersistentModelIndex local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QListView *)0x87ec6a);
  QAbstractItemView::state((QAbstractItemView *)in_stack_ffffffffffffff90);
  QAbstractItemView::setState
            ((QAbstractItemView *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  this_01 = (QListViewPrivate *)(this_00->super_QAbstractItemViewPrivate).model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(local_20);
  iVar2 = (**(code **)(*(long *)&(this_01->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate + 0x80))(this_01,local_20);
  if (iVar2 < 1) {
    QListViewPrivate::clear(in_stack_ffffffffffffff90);
  }
  else {
    QListViewPrivate::resetBatchStartRow(this_00);
    LVar3 = layoutMode((QListView *)in_stack_ffffffffffffff90);
    if (LVar3 == SinglePass) {
      in_stack_ffffffffffffff90 =
           (QListViewPrivate *)(this_00->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_38);
      iVar2 = (int)((ulong)in_RDI >> 0x20);
      (**(code **)(*(long *)&(in_stack_ffffffffffffff90->super_QAbstractItemViewPrivate).
                             super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                             super_QWidgetPrivate + 0x78))(in_stack_ffffffffffffff90,local_38);
      QListViewPrivate::doItemsLayout(this_01,iVar2);
    }
    else {
      bVar1 = QBasicTimer::isActive(&this_00->batchLayoutTimer);
      iVar2 = (int)((ulong)this_00 >> 0x20);
      if ((!bVar1) &&
         (bVar1 = QListViewPrivate::doItemsLayout(this_01,(int)((ulong)in_RDI >> 0x20)), !bVar1)) {
        QBasicTimer::start(in_RDI,iVar2,in_stack_ffffffffffffff98);
      }
    }
  }
  QAbstractItemView::doItemsLayout((QAbstractItemView *)in_stack_ffffffffffffff90);
  QAbstractItemView::setState
            ((QAbstractItemView *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListView::doItemsLayout()
{
    Q_D(QListView);
    // showing the scroll bars will trigger a resize event,
    // so we set the state to expanding to avoid
    // triggering another layout
    QAbstractItemView::State oldState = state();
    setState(ExpandingState);
    if (d->model->columnCount(d->root) > 0) { // no columns means no contents
        d->resetBatchStartRow();
        if (layoutMode() == SinglePass) {
            d->doItemsLayout(d->model->rowCount(d->root)); // layout everything
        } else if (!d->batchLayoutTimer.isActive()) {
            if (!d->doItemsLayout(d->batchSize)) // layout is done
                d->batchLayoutTimer.start(0, this); // do a new batch as fast as possible
        }
    } else { // clear the QBspTree generated by the last layout
        d->clear();
    }
    QAbstractItemView::doItemsLayout();
    setState(oldState);        // restoring the oldState
}